

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# format.h
# Opt level: O3

wchar_t * __thiscall
fmt::v5::
format_handler<fmt::v5::arg_formatter<fmt::v5::back_insert_range<fmt::v5::internal::basic_buffer<wchar_t>_>_>,_wchar_t,_fmt::v5::basic_format_context<std::back_insert_iterator<fmt::v5::internal::basic_buffer<wchar_t>_>,_wchar_t>_>
::on_format_specs(format_handler<fmt::v5::arg_formatter<fmt::v5::back_insert_range<fmt::v5::internal::basic_buffer<wchar_t>_>_>,_wchar_t,_fmt::v5::basic_format_context<std::back_insert_iterator<fmt::v5::internal::basic_buffer<wchar_t>_>,_wchar_t>_>
                  *this,wchar_t *begin,wchar_t *end)

{
  size_t *psVar1;
  basic_format_context<std::back_insert_iterator<fmt::v5::internal::basic_buffer<wchar_t>_>,_wchar_t>
  *pbVar2;
  type tVar3;
  wchar_t *pwVar4;
  wchar_t *pwVar5;
  type tVar6;
  assertion_failure *this_00;
  long lVar7;
  long lVar8;
  specs_checker<fmt::v5::internal::specs_handler<fmt::v5::basic_format_context<std::back_insert_iterator<fmt::v5::internal::basic_buffer<wchar_t>_>,_wchar_t>_>_>
  handler;
  format_specs local_78;
  specs_checker<fmt::v5::internal::specs_handler<fmt::v5::basic_format_context<std::back_insert_iterator<fmt::v5::internal::basic_buffer<wchar_t>_>,_wchar_t>_>_>
  local_60;
  arg_formatter<fmt::v5::back_insert_range<fmt::v5::internal::basic_buffer<wchar_t>_>_> local_48;
  
  pwVar5 = (this->context).
           super_context_base<std::back_insert_iterator<fmt::v5::internal::basic_buffer<wchar_t>_>,_fmt::v5::basic_format_context<std::back_insert_iterator<fmt::v5::internal::basic_buffer<wchar_t>_>,_wchar_t>,_wchar_t>
           .parse_context_.format_str_.data_;
  lVar7 = (long)begin - (long)pwVar5;
  lVar8 = lVar7 >> 2;
  if (lVar8 < 0) {
    this_00 = (assertion_failure *)__cxa_allocate_exception(0x10);
    assertion_failure::assertion_failure(this_00,"negative value");
  }
  else {
    (this->context).
    super_context_base<std::back_insert_iterator<fmt::v5::internal::basic_buffer<wchar_t>_>,_fmt::v5::basic_format_context<std::back_insert_iterator<fmt::v5::internal::basic_buffer<wchar_t>_>,_wchar_t>,_wchar_t>
    .parse_context_.format_str_.data_ = (wchar_t *)((long)pwVar5 + lVar7);
    psVar1 = &(this->context).
              super_context_base<std::back_insert_iterator<fmt::v5::internal::basic_buffer<wchar_t>_>,_fmt::v5::basic_format_context<std::back_insert_iterator<fmt::v5::internal::basic_buffer<wchar_t>_>,_wchar_t>,_wchar_t>
              .parse_context_.format_str_.size_;
    *psVar1 = *psVar1 - lVar8;
    pbVar2 = &this->context;
    tVar3 = (this->arg).type_;
    if (tVar3 == custom_type) {
      (*(this->arg).value_.field_0.custom.format)
                ((void *)(this->arg).value_.field_0.long_long_value,pbVar2);
      return (this->context).
             super_context_base<std::back_insert_iterator<fmt::v5::internal::basic_buffer<wchar_t>_>,_fmt::v5::basic_format_context<std::back_insert_iterator<fmt::v5::internal::basic_buffer<wchar_t>_>,_wchar_t>,_wchar_t>
             .parse_context_.format_str_.data_;
    }
    if (tVar3 == named_arg_type) {
      this_00 = (assertion_failure *)__cxa_allocate_exception(0x10);
      assertion_failure::assertion_failure(this_00,"invalid argument type");
    }
    else {
      local_78.super_align_spec.width_ = 0;
      local_78.super_align_spec.fill_ = L' ';
      local_78.super_align_spec.align_ = ALIGN_DEFAULT;
      local_78.super_core_format_specs.precision = -1;
      local_78.super_core_format_specs.flags = '\0';
      local_78.super_core_format_specs.type = '\0';
      local_60.
      super_specs_handler<fmt::v5::basic_format_context<std::back_insert_iterator<fmt::v5::internal::basic_buffer<wchar_t>_>,_wchar_t>_>
      .super_specs_setter<wchar_t>.specs_ = &local_78;
      local_60.
      super_specs_handler<fmt::v5::basic_format_context<std::back_insert_iterator<fmt::v5::internal::basic_buffer<wchar_t>_>,_wchar_t>_>
      .context_ = pbVar2;
      local_60.arg_type_ = tVar3;
      pwVar5 = internal::
               parse_format_specs<wchar_t,fmt::v5::internal::specs_checker<fmt::v5::internal::specs_handler<fmt::v5::basic_format_context<std::back_insert_iterator<fmt::v5::internal::basic_buffer<wchar_t>>,wchar_t>>>&>
                         (begin,end,&local_60);
      if ((pwVar5 == end) || (*pwVar5 != L'}')) {
        internal::error_handler::on_error((error_handler *)begin,"missing \'}\' in format string");
      }
      pwVar4 = (pbVar2->
               super_context_base<std::back_insert_iterator<fmt::v5::internal::basic_buffer<wchar_t>_>,_fmt::v5::basic_format_context<std::back_insert_iterator<fmt::v5::internal::basic_buffer<wchar_t>_>,_wchar_t>,_wchar_t>
               ).parse_context_.format_str_.data_;
      lVar7 = (long)pwVar5 - (long)pwVar4;
      lVar8 = lVar7 >> 2;
      if (-1 < lVar8) {
        (this->context).
        super_context_base<std::back_insert_iterator<fmt::v5::internal::basic_buffer<wchar_t>_>,_fmt::v5::basic_format_context<std::back_insert_iterator<fmt::v5::internal::basic_buffer<wchar_t>_>,_wchar_t>,_wchar_t>
        .parse_context_.format_str_.data_ = (wchar_t *)((long)pwVar4 + lVar7);
        psVar1 = &(this->context).
                  super_context_base<std::back_insert_iterator<fmt::v5::internal::basic_buffer<wchar_t>_>,_fmt::v5::basic_format_context<std::back_insert_iterator<fmt::v5::internal::basic_buffer<wchar_t>_>,_wchar_t>,_wchar_t>
                  .parse_context_.format_str_.size_;
        *psVar1 = *psVar1 - lVar8;
        local_48.
        super_arg_formatter_base<fmt::v5::back_insert_range<fmt::v5::internal::basic_buffer<wchar_t>_>_>
        .writer_.out_.container =
             (this->context).
             super_context_base<std::back_insert_iterator<fmt::v5::internal::basic_buffer<wchar_t>_>,_fmt::v5::basic_format_context<std::back_insert_iterator<fmt::v5::internal::basic_buffer<wchar_t>_>,_wchar_t>,_wchar_t>
             .out_.container;
        local_48.
        super_arg_formatter_base<fmt::v5::back_insert_range<fmt::v5::internal::basic_buffer<wchar_t>_>_>
        .writer_.locale_.locale_ =
             (this->context).
             super_context_base<std::back_insert_iterator<fmt::v5::internal::basic_buffer<wchar_t>_>,_fmt::v5::basic_format_context<std::back_insert_iterator<fmt::v5::internal::basic_buffer<wchar_t>_>,_wchar_t>,_wchar_t>
             .loc_.locale_;
        local_48.
        super_arg_formatter_base<fmt::v5::back_insert_range<fmt::v5::internal::basic_buffer<wchar_t>_>_>
        .specs_ = &local_78;
        local_48.ctx_ = pbVar2;
        tVar6 = visit_format_arg<fmt::v5::arg_formatter<fmt::v5::back_insert_range<fmt::v5::internal::basic_buffer<wchar_t>>>,fmt::v5::basic_format_context<std::back_insert_iterator<fmt::v5::internal::basic_buffer<wchar_t>>,wchar_t>>
                          (&local_48,&this->arg);
        (this->context).
        super_context_base<std::back_insert_iterator<fmt::v5::internal::basic_buffer<wchar_t>_>,_fmt::v5::basic_format_context<std::back_insert_iterator<fmt::v5::internal::basic_buffer<wchar_t>_>,_wchar_t>,_wchar_t>
        .out_.container = tVar6.container;
        return pwVar5;
      }
      this_00 = (assertion_failure *)__cxa_allocate_exception(0x10);
      assertion_failure::assertion_failure(this_00,"negative value");
    }
  }
  __cxa_throw(this_00,&assertion_failure::typeinfo,std::logic_error::~logic_error);
}

Assistant:

const Char *on_format_specs(const Char *begin, const Char *end) {
    auto &parse_ctx = context.parse_context();
    parse_ctx.advance_to(begin);
    internal::custom_formatter<Char, Context> f(context);
    if (visit_format_arg(f, arg))
      return parse_ctx.begin();
    basic_format_specs<Char> specs;
    using internal::specs_handler;
    internal::specs_checker<specs_handler<Context>>
        handler(specs_handler<Context>(specs, context), arg.type());
    begin = parse_format_specs(begin, end, handler);
    if (begin == end || *begin != '}')
      on_error("missing '}' in format string");
    parse_ctx.advance_to(begin);
    context.advance_to(visit_format_arg(ArgFormatter(context, &specs), arg));
    return begin;
  }